

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_sha512.cpp
# Opt level: O1

void __thiscall CHMAC_SHA512::CHMAC_SHA512(CHMAC_SHA512 *this,uchar *key,size_t keylen)

{
  CSHA512 *this_00;
  long lVar1;
  long in_FS_OFFSET;
  uchar rkey [128];
  CSHA512 local_180;
  uint local_b8 [34];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA512::CSHA512(&this->outer);
  CSHA512::CSHA512(&this->inner);
  if (keylen < 0x81) {
    __memcpy_chk(local_b8,key,keylen,0x80);
    __memset_chk((long)local_b8 + keylen,0,0x80 - keylen,0x80 - keylen);
  }
  else {
    CSHA512::CSHA512(&local_180);
    this_00 = CSHA512::Write(&local_180,key,keylen);
    CSHA512::Finalize(this_00,(uchar *)local_b8);
    local_b8[0x10] = 0;
    local_b8[0x11] = 0;
    local_b8[0x12] = 0;
    local_b8[0x13] = 0;
    local_b8[0x14] = 0;
    local_b8[0x15] = 0;
    local_b8[0x16] = 0;
    local_b8[0x17] = 0;
    local_b8[0x18] = 0;
    local_b8[0x19] = 0;
    local_b8[0x1a] = 0;
    local_b8[0x1b] = 0;
    local_b8[0x1c] = 0;
    local_b8[0x1d] = 0;
    local_b8[0x1e] = 0;
    local_b8[0x1f] = 0;
  }
  lVar1 = 0;
  do {
    *(uint *)((long)local_b8 + lVar1) = *(uint *)((long)local_b8 + lVar1) ^ 0x5c5c5c5c;
    *(uint *)((long)local_b8 + lVar1 + 4) = *(uint *)((long)local_b8 + lVar1 + 4) ^ 0x5c5c5c5c;
    *(uint *)((long)local_b8 + lVar1 + 8) = *(uint *)((long)local_b8 + lVar1 + 8) ^ 0x5c5c5c5c;
    *(uint *)((long)local_b8 + lVar1 + 0xc) = *(uint *)((long)local_b8 + lVar1 + 0xc) ^ 0x5c5c5c5c;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x80);
  CSHA512::Write(&this->outer,(uchar *)local_b8,0x80);
  lVar1 = 0;
  do {
    *(uint *)((long)local_b8 + lVar1) = *(uint *)((long)local_b8 + lVar1) ^ 0x6a6a6a6a;
    *(uint *)((long)local_b8 + lVar1 + 4) = *(uint *)((long)local_b8 + lVar1 + 4) ^ 0x6a6a6a6a;
    *(uint *)((long)local_b8 + lVar1 + 8) = *(uint *)((long)local_b8 + lVar1 + 8) ^ 0x6a6a6a6a;
    *(uint *)((long)local_b8 + lVar1 + 0xc) = *(uint *)((long)local_b8 + lVar1 + 0xc) ^ 0x6a6a6a6a;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x80);
  CSHA512::Write(&this->inner,(uchar *)local_b8,0x80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CHMAC_SHA512::CHMAC_SHA512(const unsigned char* key, size_t keylen)
{
    unsigned char rkey[128];
    if (keylen <= 128) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, 128 - keylen);
    } else {
        CSHA512().Write(key, keylen).Finalize(rkey);
        memset(rkey + 64, 0, 64);
    }

    for (int n = 0; n < 128; n++)
        rkey[n] ^= 0x5c;
    outer.Write(rkey, 128);

    for (int n = 0; n < 128; n++)
        rkey[n] ^= 0x5c ^ 0x36;
    inner.Write(rkey, 128);
}